

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

HEADER_HANDLE header_create(void)

{
  AMQP_VALUE pAVar1;
  HEADER_HANDLE local_10;
  HEADER_INSTANCE *header_instance;
  
  local_10 = (HEADER_HANDLE)malloc(8);
  if (local_10 != (HEADER_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x70);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (HEADER_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

HEADER_HANDLE header_create(void)
{
    HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)malloc(sizeof(HEADER_INSTANCE));
    if (header_instance != NULL)
    {
        header_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(112);
        if (header_instance->composite_value == NULL)
        {
            free(header_instance);
            header_instance = NULL;
        }
    }

    return header_instance;
}